

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceTiledExamples.cpp
# Opt level: O3

void readTiled1(char *fileName,Array2D<GZ> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  GZ *pGVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  TiledInputFile in;
  FrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(&in,fileName,iVar2);
  Imf_3_2::TiledInputFile::header();
  piVar4 = (int *)Imf_3_2::Header::dataWindow();
  iVar2 = *piVar4;
  iVar3 = piVar4[1];
  iVar1 = piVar4[3];
  *width = (piVar4[2] - iVar2) + 1;
  lVar6 = ((long)iVar1 - (long)iVar3) + 1;
  *height = (int)lVar6;
  lVar9 = (long)*width;
  pGVar5 = (GZ *)operator_new__(-(ulong)((ulong)(lVar9 * lVar6) >> 0x3d != 0) | lVar9 * lVar6 * 8);
  lVar7 = lVar9;
  if (pixels->_data != (GZ *)0x0) {
    operator_delete__(pixels->_data);
    lVar7 = (long)*width;
  }
  pixels->_sizeX = lVar6;
  pixels->_sizeY = lVar9;
  pixels->_data = pGVar5;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar8 = -(long)iVar3;
  lVar6 = (long)-iVar2;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice
            (local_68,HALF,(char *)(pGVar5 + lVar9 * lVar8 + lVar6),8,lVar7 << 3,1,1,0.0,false,false
            );
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"G");
  Imf_3_2::Slice::Slice
            (local_68,FLOAT,(char *)&pixels->_data[lVar8 * pixels->_sizeY + lVar6].z,8,
             (long)*width << 3,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"Z");
  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
  iVar2 = Imf_3_2::TiledInputFile::numXTiles((int)&in);
  iVar3 = Imf_3_2::TiledInputFile::numYTiles((int)&in);
  Imf_3_2::TiledInputFile::readTiles((int)&in,0,iVar2 + -1,0,iVar3 + -1);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&frameBuffer);
  Imf_3_2::TiledInputFile::~TiledInputFile(&in);
  return;
}

Assistant:

void
readTiled1 (const char fileName[], Array2D<GZ>& pixels, int& width, int& height)
{
    TiledInputFile in (fileName);

    Box2i dw = in.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;
    int dx   = dw.min.x;
    int dy   = dw.min.y;

    pixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                       // type
            (char*) &pixels[-dy][-dx].g,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                      // type
            (char*) &pixels[-dy][-dx].z,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    in.setFrameBuffer (frameBuffer);
    in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
}